

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscalls.cpp
# Opt level: O0

int skiwi::_skiwi_write(int fd,void *buffer,uint count)

{
  ssize_t sVar1;
  uint count_local;
  void *buffer_local;
  int fd_local;
  
  if (fd < 0) {
    buffer_local._4_4_ = 0;
  }
  else {
    sVar1 = write(fd,buffer,(ulong)count);
    buffer_local._4_4_ = (int)sVar1;
  }
  return buffer_local._4_4_;
}

Assistant:

int _skiwi_write(int fd, const void* buffer, unsigned int count)
  {
  if (fd < 0)
    return 0;
#ifdef _WIN32
  return _write(fd, buffer, count);
#else
  return write(fd, buffer, count);
#endif
  }